

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

void FaceMovementDirection(AActor *actor)

{
  if ((ulong)actor->movedir < 8) {
    (actor->Angles).Yaw.Degrees = *(double *)(&DAT_006ad778 + (ulong)actor->movedir * 8);
  }
  return;
}

Assistant:

void FaceMovementDirection(AActor *actor)
{
	switch (actor->movedir)
	{
	case DI_EAST:
		actor->Angles.Yaw = 0.;
		break;
	case DI_NORTHEAST:
		actor->Angles.Yaw = 45.;
		break;
	case DI_NORTH:
		actor->Angles.Yaw = 90.;
		break;
	case DI_NORTHWEST:
		actor->Angles.Yaw = 135.;
		break;
	case DI_WEST:
		actor->Angles.Yaw = 180.;
		break;
	case DI_SOUTHWEST:
		actor->Angles.Yaw = 225.;
		break;
	case DI_SOUTH:
		actor->Angles.Yaw = 270.;
		break;
	case DI_SOUTHEAST:
		actor->Angles.Yaw = 315.;
		break;
	}
}